

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleLockCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  cmFileCommand *pcVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  ostream *poVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  string *psVar10;
  long *plVar11;
  FILE *__stream;
  cmGlobalGenerator *pcVar12;
  size_type *psVar13;
  cmFileLockPool *this_00;
  pointer pbVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  string parentDir;
  cmFileLockResult fileLockResult;
  string path;
  string result;
  string resultVariable;
  ostringstream e;
  int local_26c;
  string local_268;
  cmFileCommand *local_248;
  uint local_240;
  uint local_23c;
  char *local_238;
  cmFileLockResult local_230;
  string local_228;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  string local_50;
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x21) {
    pcVar1 = (this->super_cmCommand).Makefile;
    local_1c8._0_8_ = local_1c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"sub-command LOCK requires at least two arguments.","");
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    bVar4 = false;
    goto LAB_001e88f8;
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  pcVar2 = pbVar14[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar2,pcVar2 + pbVar14[1]._M_string_length);
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar17 = (ulong)((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x41;
  bVar4 = !bVar17;
  local_248 = this;
  if (bVar17) {
    local_240 = 0;
    local_26c = 2;
    local_238 = (char *)0xffffffffffffffff;
    local_23c = 0;
  }
  else {
    local_238 = (char *)0xffffffffffffffff;
    local_26c = 2;
    local_23c = 0;
    local_240 = 0;
    uVar16 = 2;
    do {
      uVar15 = (uint)uVar16;
      uVar6 = std::__cxx11::string::compare((char *)(pbVar14 + uVar16));
      if ((int)uVar6 == 0) {
        local_23c = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
      }
      else {
        uVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar16));
        if ((int)uVar6 == 0) {
          local_240 = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar16));
          if (iVar5 == 0) {
            uVar15 = uVar15 + 1;
            uVar16 = (ulong)uVar15;
            pbVar14 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (uVar16 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14
                                >> 5)) {
              iVar5 = std::__cxx11::string::compare((char *)(pbVar14 + uVar16));
              bVar17 = true;
              if (iVar5 == 0) {
                local_26c = 0;
              }
              else {
                iVar5 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar16));
                if (iVar5 == 0) {
                  local_26c = 1;
                }
                else {
                  iVar5 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar16));
                  if (iVar5 != 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1c8,"expected FUNCTION, FILE or PROCESS after GUARD"
                               ,0x2e);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1c8,", but got:\n  \"",0xe);
                    pbVar14 = (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_1c8,pbVar14[uVar16]._M_dataplus._M_p,
                                        pbVar14[uVar16]._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
                    pcVar1 = (local_248->super_cmCommand).Makefile;
                    std::__cxx11::stringbuf::str();
                    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_268);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_268._M_dataplus._M_p != &local_268.field_2) {
                      operator_delete(local_268._M_dataplus._M_p,
                                      local_268.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
                    std::ios_base::~ios_base(local_158);
                    goto LAB_001e81b0;
                  }
                  local_26c = 2;
                }
              }
            }
            else {
              pcVar1 = (local_248->super_cmCommand).Makefile;
              local_1c8._0_8_ = local_1c8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"expected FUNCTION, FILE or PROCESS after GUARD","");
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1c8);
              if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
                operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
              }
LAB_001e81b0:
              bVar17 = false;
            }
            if (!bVar17) break;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar16));
            if (iVar5 == 0) {
              uVar15 = uVar15 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar15) {
                pcVar1 = (local_248->super_cmCommand).Makefile;
                local_1c8._0_8_ = local_1c8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,"expected variable name after RESULT_VARIABLE","");
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1c8);
LAB_001e86f7:
                if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
                  operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
                }
                break;
              }
              std::__cxx11::string::_M_assign((string *)&local_1e8);
            }
            else {
              iVar5 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar16));
              if (iVar5 != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,
                           "expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or TIMEOUT\n",0x3f);
                pcVar3 = local_248;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,"but got: \"",10);
                pbVar14 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1c8,pbVar14[uVar16]._M_dataplus._M_p,
                                    pbVar14[uVar16]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
                pcVar1 = (pcVar3->super_cmCommand).Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_268);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p,
                                  local_268.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
                std::ios_base::~ios_base(local_158);
                break;
              }
              uVar15 = uVar15 + 1;
              uVar16 = (ulong)uVar15;
              pbVar14 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5) <=
                  uVar16) {
                pcVar1 = (local_248->super_cmCommand).Makefile;
                local_1c8._0_8_ = local_1c8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,"expected timeout value after TIMEOUT","");
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1c8);
                goto LAB_001e86f7;
              }
              bVar17 = cmSystemTools::StringToLong
                                 (pbVar14[uVar16]._M_dataplus._M_p,(long *)&local_208);
              bVar18 = (long)local_208._M_dataplus._M_p < 0;
              _Var8._M_p = local_208._M_dataplus._M_p;
              if (!bVar17 || bVar18) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,"TIMEOUT value \"",0xf);
                pbVar14 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1c8,pbVar14[uVar16]._M_dataplus._M_p,
                                    pbVar14[uVar16]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" is not an unsigned integer.",0x1d);
                pcVar1 = (local_248->super_cmCommand).Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_268);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_dataplus._M_p != &local_268.field_2) {
                  operator_delete(local_268._M_dataplus._M_p,
                                  local_268.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
                std::ios_base::~ios_base(local_158);
                _Var8._M_p = local_238;
              }
              local_238 = _Var8._M_p;
              if (!bVar17 || bVar18) break;
            }
          }
        }
      }
      uVar16 = (ulong)(uVar15 + 1);
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5;
      bVar4 = uVar16 < uVar9;
    } while (uVar16 < uVar9);
  }
  if (bVar4) {
    bVar4 = false;
  }
  else {
    if ((local_23c & 1) != 0) {
      std::__cxx11::string::append((char *)&local_228);
    }
    bVar4 = cmsys::SystemTools::FileIsFullPath(&local_228);
    pcVar3 = local_248;
    if (!bVar4) {
      psVar10 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                          ((local_248->super_cmCommand).Makefile);
      pcVar2 = (psVar10->_M_dataplus)._M_p;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,pcVar2,pcVar2 + psVar10->_M_string_length);
      std::__cxx11::string::append((char *)&local_268);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_268,(ulong)local_228._M_dataplus._M_p);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar13) {
        local_1c8._16_8_ = *psVar13;
        local_1c8._24_8_ = plVar11[3];
        local_1c8._0_8_ = local_1c8 + 0x10;
      }
      else {
        local_1c8._16_8_ = *psVar13;
        local_1c8._0_8_ = (size_type *)*plVar11;
      }
      local_1c8._8_8_ = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_228,(string *)local_1c8);
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
    }
    cmsys::SystemTools::CollapseFullPath((string *)local_1c8,&local_228);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    cmsys::SystemTools::GetParentDirectory(&local_268,&local_228);
    bVar4 = cmsys::SystemTools::MakeDirectory(&local_268,(mode_t *)0x0);
    if (bVar4) {
      __stream = (FILE *)cmsys::SystemTools::Fopen(&local_228,"w");
      if (__stream == (FILE *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"file\n  \"",8);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c8,local_228._M_dataplus._M_p,
                            local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\"\ncreation failed (check permissions).",0x26);
        pcVar1 = (pcVar3->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_208);
        goto LAB_001e8512;
      }
      fclose(__stream);
      pcVar12 = cmMakefile::GetGlobalGenerator((pcVar3->super_cmCommand).Makefile);
      local_230 = cmFileLockResult::MakeOk();
      this_00 = &pcVar12->FileLockPool;
      if ((local_240 & 1) == 0) {
        if (local_26c == 2) {
          local_230 = cmFileLockPool::LockProcessScope(this_00,&local_228,(unsigned_long)local_238);
        }
        else if (local_26c == 1) {
          local_230 = cmFileLockPool::LockFileScope(this_00,&local_228,(unsigned_long)local_238);
        }
        else {
          local_230 = cmFileLockPool::LockFunctionScope(this_00,&local_228,(unsigned_long)local_238)
          ;
        }
      }
      else {
        local_230 = cmFileLockPool::Release(this_00,&local_228);
      }
      cmFileLockResult::GetOutputMessage_abi_cxx11_(&local_208,&local_230);
      if ((local_1e8._M_string_length != 0) || (bVar4 = cmFileLockResult::IsOk(&local_230), bVar4))
      {
        bVar4 = true;
        if (local_1e8._M_string_length != 0) {
          cmMakefile::AddDefinition
                    ((local_248->super_cmCommand).Makefile,&local_1e8,local_208._M_dataplus._M_p);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"error locking file\n  \"",0x16);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c8,local_228._M_dataplus._M_p,
                            local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_208._M_dataplus._M_p,local_208._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
        pcVar1 = (pcVar3->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"directory\n  \"",0xd)
      ;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c8,local_268._M_dataplus._M_p,local_268._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\ncreation failed ",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"(check permissions).",0x14);
      pcVar1 = (pcVar3->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_208);
LAB_001e8512:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccured = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
LAB_001e88f8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool cmFileCommand::HandleLockCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard
  {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if (args.size() < 2) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command LOCK requires at least two arguments.");
    return false;
  }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i) {
    if (args[i] == "DIRECTORY") {
      directory = true;
    } else if (args[i] == "RELEASE") {
      release = true;
    } else if (args[i] == "GUARD") {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size()) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, merr);
        return false;
      }
      if (args[i] == "FUNCTION") {
        guard = GUARD_FUNCTION;
      } else if (args[i] == "FILE") {
        guard = GUARD_FILE;
      } else if (args[i] == "PROCESS") {
        guard = GUARD_PROCESS;
      } else {
        std::ostringstream e;
        e << merr << ", but got:\n  \"" << args[i] << "\".";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return false;
      }

    } else if (args[i] == "RESULT_VARIABLE") {
      ++i;
      if (i >= args.size()) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "expected variable name after RESULT_VARIABLE");
        return false;
      }
      resultVariable = args[i];
    } else if (args[i] == "TIMEOUT") {
      ++i;
      if (i >= args.size()) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "expected timeout value after TIMEOUT");
        return false;
      }
      long scanned;
      if (!cmSystemTools::StringToLong(args[i].c_str(), &scanned) ||
          scanned < 0) {
        std::ostringstream e;
        e << "TIMEOUT value \"" << args[i] << "\" is not an unsigned integer.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return false;
      }
      timeout = static_cast<unsigned long>(scanned);
    } else {
      std::ostringstream e;
      e << "expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or TIMEOUT\n";
      e << "but got: \"" << args[i] << "\".";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }

  if (directory) {
    path += "/cmake.lock";
  }

  if (!cmsys::SystemTools::FileIsFullPath(path)) {
    path = this->Makefile->GetCurrentSourceDirectory() + "/" + path;
  }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(path);

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir)) {
    std::ostringstream e;
    e << "directory\n  \"" << parentDir << "\"\ncreation failed ";
    e << "(check permissions).";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  FILE* file = cmsys::SystemTools::Fopen(path, "w");
  if (!file) {
    std::ostringstream e;
    e << "file\n  \"" << path << "\"\ncreation failed (check permissions).";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool =
    this->Makefile->GetGlobalGenerator()->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release) {
    fileLockResult = lockPool.Release(path);
  } else {
    switch (guard) {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccured();
        return false;
    }
  }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk()) {
    std::ostringstream e;
    e << "error locking file\n  \"" << path << "\"\n" << result << ".";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  if (!resultVariable.empty()) {
    this->Makefile->AddDefinition(resultVariable, result.c_str());
  }

  return true;
#else
  static_cast<void>(args);
  this->SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}